

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_0::BlittingImages::copyRegionToTextureLevel
          (BlittingImages *this,ConstPixelBufferAccess src,PixelBufferAccess dst,CopyRegion region)

{
  VkFilter VVar1;
  undefined8 uVar2;
  PixelBufferAccess PVar3;
  bool bVar4;
  MirrorMode MVar5;
  MirrorMode MVar6;
  uint in_ECX;
  MirrorMode MVar7;
  MirrorMode MVar9;
  PixelBufferAccess *in_RDX;
  int iVar10;
  int y;
  FilterMode filter;
  ConstPixelBufferAccess *in_RSI;
  uint uVar11;
  ConstPixelBufferAccess *__return_storage_ptr__;
  int iVar12;
  ulong uVar13;
  int y_00;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int width;
  VkOffset3D x2;
  VkOffset3D x2_00;
  VkOffset3D regionOffset;
  VkOffset3D regionOffset_00;
  VkOffset3D x1;
  VkOffset3D x1_00;
  VkOffset3D regionExtent;
  VkOffset3D regionExtent_00;
  MirrorMode mirrorMode;
  MirrorMode MVar19;
  ConstPixelBufferAccess depthSrc;
  PixelBufferAccess dstSubRegion;
  ConstPixelBufferAccess srcSubRegion;
  PixelBufferAccess unclampedSubRegion;
  PixelBufferAccess local_80;
  PixelBufferAccess local_58;
  ulong uVar8;
  undefined8 extraout_RDX;
  
  PVar3.super_ConstPixelBufferAccess = dst.super_ConstPixelBufferAccess;
  uVar2 = dst.super_ConstPixelBufferAccess._28_8_;
  uVar15 = src._16_8_;
  x2.z = in_ECX;
  x2._0_8_ = in_RDX;
  uVar8 = (ulong)in_ECX;
  x1.z = src.m_pitch.m_data[2];
  x1.x = (int)uVar15;
  x1.y = (int)(uVar15 >> 0x20);
  MVar5 = getMirrorMode(x1,x2);
  x2_00.z = (deInt32)uVar8;
  x2_00.x = (int)extraout_RDX;
  x2_00.y = (int)((ulong)extraout_RDX >> 0x20);
  x1_00.z = dst.super_ConstPixelBufferAccess.m_pitch.m_data[2];
  x1_00.x = dst.super_ConstPixelBufferAccess.m_size.m_data[2];
  x1_00.y = dst.super_ConstPixelBufferAccess.m_pitch.m_data[0];
  MVar6 = getMirrorMode(x1_00,x2_00);
  iVar12 = (int)src.m_data;
  y = src.m_pitch.m_data[0];
  iVar16 = (int)PVar3.super_ConstPixelBufferAccess.m_data;
  y_00 = PVar3.super_ConstPixelBufferAccess.m_pitch.m_data[0];
  if (MVar5 == MVar6) {
    mirrorMode = MIRROR_MODE_NONE;
  }
  else {
    MVar7 = MVar5 ^ MIRROR_MODE_XY;
    mirrorMode = MIRROR_MODE_Y;
    if (MVar7 != MIRROR_MODE_NONE || (MVar6 ^ MIRROR_MODE_X) != MIRROR_MODE_NONE) {
      MVar9 = MVar6 ^ MIRROR_MODE_XY;
      if ((((MVar5 ^ MIRROR_MODE_X) != MIRROR_MODE_NONE || MVar9 != MIRROR_MODE_NONE) &&
          (mirrorMode = MIRROR_MODE_Y,
          (MVar5 ^ MIRROR_MODE_Y) != MIRROR_MODE_NONE || MVar6 != MIRROR_MODE_NONE)) &&
         (MVar5 != MIRROR_MODE_NONE || (MVar6 ^ MIRROR_MODE_Y) != MIRROR_MODE_NONE)) {
        MVar19 = MIRROR_MODE_X;
        mirrorMode = MIRROR_MODE_X;
        if ((((MVar6 ^ MIRROR_MODE_X) != MIRROR_MODE_NONE || MVar5 != MIRROR_MODE_NONE) &&
            (mirrorMode = MVar19,
            (MVar5 ^ MIRROR_MODE_X) != MIRROR_MODE_NONE || MVar6 != MIRROR_MODE_NONE)) &&
           (((MVar6 ^ MIRROR_MODE_Y) != MIRROR_MODE_NONE || MVar7 != MIRROR_MODE_NONE &&
            ((MVar5 ^ MIRROR_MODE_Y) != MIRROR_MODE_NONE || MVar9 != MIRROR_MODE_NONE)))) {
          mirrorMode = MIRROR_MODE_XY;
          if ((MVar7 != MIRROR_MODE_NONE || MVar6 != MIRROR_MODE_NONE) &&
             (MVar5 != MIRROR_MODE_NONE || MVar9 != MIRROR_MODE_NONE)) {
            mirrorMode = MIRROR_MODE_LAST;
            goto LAB_004a5cf0;
          }
        }
      }
    }
    iVar14 = src.m_size.m_data[2];
    iVar10 = iVar14;
    if (x1.z < iVar14) {
      iVar10 = x1.z;
    }
    iVar18 = y;
    if (iVar12 < y) {
      iVar18 = iVar12;
    }
    uVar8 = src._28_8_;
    if (x1.z < iVar14) {
      uVar8 = uVar15;
    }
    if (iVar12 < y) {
      src._28_8_ = uVar15;
    }
    iVar12 = (int)((ulong)src._28_8_ >> 0x20);
    uVar11 = PVar3.super_ConstPixelBufferAccess.m_size.m_data[2];
    uVar17 = uVar11;
    if (dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] < (int)uVar11) {
      uVar17 = dst.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    }
    iVar14 = y_00;
    if (iVar16 < y_00) {
      iVar14 = iVar16;
    }
    if (dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] < (int)uVar11) {
      uVar2 = dst.super_ConstPixelBufferAccess._16_8_;
    }
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)uVar2;
    if (iVar16 < y_00) {
      iVar16 = y_00;
    }
    uVar15 = CONCAT44(iVar18,iVar10);
    dst.super_ConstPixelBufferAccess._16_8_ = ZEXT48(uVar17);
    src._28_8_ = uVar8 & 0xffffffff;
    y = iVar18;
    y_00 = iVar14;
  }
LAB_004a5cf0:
  iVar14 = (int)uVar15;
  width = (int)src._28_8_ - iVar14;
  iVar12 = iVar12 - y;
  iVar10 = (int)dst.super_ConstPixelBufferAccess._16_8_;
  iVar18 = dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] - iVar10;
  uVar17 = iVar16 - y_00;
  uVar13 = (ulong)uVar17;
  VVar1 = (this->super_CopiesAndBlittingTestInstance).m_params.field_3.filter;
  uVar8 = (ulong)(VVar1 == VK_FILTER_LINEAR);
  bVar4 = tcu::isCombinedDepthStencilType((in_RSI->m_format).type);
  filter = (FilterMode)(VVar1 == VK_FILTER_LINEAR);
  if (bVar4) {
    bVar4 = tcu::hasDepthComponent((in_RSI->m_format).order);
    if (bVar4) {
      tcu::getSubregion(&dstSubRegion.super_ConstPixelBufferAccess,in_RSI,iVar14,y,width,iVar12);
      tcu::getEffectiveDepthStencilAccess
                (&srcSubRegion,&dstSubRegion.super_ConstPixelBufferAccess,MODE_DEPTH);
      tcu::getSubregion((PixelBufferAccess *)&depthSrc,in_RDX,iVar10,y_00,iVar18,uVar17);
      tcu::getEffectiveDepthStencilAccess(&dstSubRegion,(PixelBufferAccess *)&depthSrc,MODE_DEPTH);
      tcu::scale(&dstSubRegion,&srcSubRegion,filter);
      if (VVar1 == VK_FILTER_LINEAR) {
        tcu::getEffectiveDepthStencilAccess(&depthSrc,in_RSI,MODE_DEPTH);
        tcu::TextureLevel::getAccess
                  (&local_80,
                   (this->m_unclampedExpectedTextureLevel).
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        uVar8 = uVar13;
        tcu::getSubregion(&local_58,&local_80,iVar10,y_00,iVar18,uVar17);
        tcu::getEffectiveDepthStencilAccess(&unclampedSubRegion,&local_58,MODE_DEPTH);
        regionExtent.y = 0;
        regionExtent.x = filter;
        regionOffset.z = width;
        regionOffset.x = (int)uVar15;
        regionOffset.y = (int)(uVar15 >> 0x20);
        regionExtent.z = (deInt32)uVar8;
        scaleFromWholeSrcBuffer(&unclampedSubRegion,&depthSrc,regionOffset,regionExtent,mirrorMode);
      }
    }
    bVar4 = tcu::hasStencilComponent((in_RSI->m_format).order);
    if (!bVar4) {
      return;
    }
    tcu::getSubregion(&dstSubRegion.super_ConstPixelBufferAccess,in_RSI,iVar14,y,width,iVar12);
    tcu::getEffectiveDepthStencilAccess
              (&srcSubRegion,&dstSubRegion.super_ConstPixelBufferAccess,MODE_STENCIL);
    tcu::getSubregion((PixelBufferAccess *)&depthSrc,in_RDX,iVar10,y_00,iVar18,uVar17);
    tcu::getEffectiveDepthStencilAccess(&dstSubRegion,(PixelBufferAccess *)&depthSrc,MODE_STENCIL);
    blit(&dstSubRegion,&srcSubRegion,filter,mirrorMode);
    if (VVar1 != VK_FILTER_LINEAR) {
      return;
    }
    tcu::getEffectiveDepthStencilAccess(&depthSrc,in_RSI,MODE_STENCIL);
    tcu::TextureLevel::getAccess
              (&local_80,
               (this->m_unclampedExpectedTextureLevel).
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
               ptr);
    tcu::getSubregion(&local_58,&local_80,iVar10,y_00,iVar18,uVar17);
    __return_storage_ptr__ = &unclampedSubRegion.super_ConstPixelBufferAccess;
    tcu::getEffectiveDepthStencilAccess
              ((PixelBufferAccess *)__return_storage_ptr__,&local_58,MODE_STENCIL);
    in_RSI = &depthSrc;
    uVar8 = (ulong)filter;
  }
  else {
    tcu::getSubregion(&srcSubRegion,in_RSI,iVar14,y,width,iVar12);
    tcu::getSubregion(&dstSubRegion,in_RDX,iVar10,y_00,iVar18,uVar17);
    blit(&dstSubRegion,&srcSubRegion,filter,mirrorMode);
    if (VVar1 != VK_FILTER_LINEAR) {
      return;
    }
    tcu::TextureLevel::getAccess
              (&unclampedSubRegion,
               (this->m_unclampedExpectedTextureLevel).
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
               ptr);
    __return_storage_ptr__ = &depthSrc;
    tcu::getSubregion((PixelBufferAccess *)__return_storage_ptr__,&unclampedSubRegion,iVar10,y_00,
                      iVar18,uVar17);
  }
  regionOffset_00.z = width;
  regionOffset_00.x = (int)uVar15;
  regionOffset_00.y = (int)(uVar15 >> 0x20);
  regionExtent_00.z = (deInt32)uVar13;
  regionExtent_00.x = (int)uVar8;
  regionExtent_00.y = (int)(uVar8 >> 0x20);
  scaleFromWholeSrcBuffer
            ((PixelBufferAccess *)__return_storage_ptr__,in_RSI,regionOffset_00,regionExtent_00,
             mirrorMode);
  return;
}

Assistant:

void BlittingImages::copyRegionToTextureLevel (tcu::ConstPixelBufferAccess src, tcu::PixelBufferAccess dst, CopyRegion region)
{
	const MirrorMode mirrorMode = getMirrorMode(region.imageBlit.srcOffsets[0],
												region.imageBlit.srcOffsets[1],
												region.imageBlit.dstOffsets[0],
												region.imageBlit.dstOffsets[1]);

	flipCoordinates(region, mirrorMode);

	const VkOffset3D					srcOffset		= region.imageBlit.srcOffsets[0];
	const VkOffset3D					srcExtent		=
	{
		region.imageBlit.srcOffsets[1].x - srcOffset.x,
		region.imageBlit.srcOffsets[1].y - srcOffset.y,
		region.imageBlit.srcOffsets[1].z - srcOffset.z
	};
	const VkOffset3D					dstOffset		= region.imageBlit.dstOffsets[0];
	const VkOffset3D					dstExtent		=
	{
		region.imageBlit.dstOffsets[1].x - dstOffset.x,
		region.imageBlit.dstOffsets[1].y - dstOffset.y,
		region.imageBlit.dstOffsets[1].z - dstOffset.z
	};
	const tcu::Sampler::FilterMode		filter			= (m_params.filter == VK_FILTER_LINEAR) ? tcu::Sampler::LINEAR : tcu::Sampler::NEAREST;

	if (tcu::isCombinedDepthStencilType(src.getFormat().type))
	{
		DE_ASSERT(src.getFormat() == dst.getFormat());
		// Scale depth.
		if (tcu::hasDepthComponent(src.getFormat().order))
		{
			const tcu::ConstPixelBufferAccess	srcSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y), tcu::Sampler::MODE_DEPTH);
			const tcu::PixelBufferAccess		dstSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_DEPTH);
			tcu::scale(dstSubRegion, srcSubRegion, filter);

			if (filter == tcu::Sampler::LINEAR)
			{
				const tcu::ConstPixelBufferAccess	depthSrc			= getEffectiveDepthStencilAccess(src, tcu::Sampler::MODE_DEPTH);
				const tcu::PixelBufferAccess		unclampedSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_DEPTH);
				scaleFromWholeSrcBuffer(unclampedSubRegion, depthSrc, srcOffset, srcExtent, filter);
			}
		}

		// Scale stencil.
		if (tcu::hasStencilComponent(src.getFormat().order))
		{
			const tcu::ConstPixelBufferAccess	srcSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y), tcu::Sampler::MODE_STENCIL);
			const tcu::PixelBufferAccess		dstSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_STENCIL);
			blit(dstSubRegion, srcSubRegion, filter, mirrorMode);

			if (filter == tcu::Sampler::LINEAR)
			{
				const tcu::ConstPixelBufferAccess	stencilSrc			= getEffectiveDepthStencilAccess(src, tcu::Sampler::MODE_STENCIL);
				const tcu::PixelBufferAccess		unclampedSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_STENCIL);
				scaleFromWholeSrcBuffer(unclampedSubRegion, stencilSrc, srcOffset, srcExtent, filter);
			}
		}
	}
	else
	{
		const tcu::ConstPixelBufferAccess	srcSubRegion	= tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y);
		const tcu::PixelBufferAccess		dstSubRegion	= tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y);
		blit(dstSubRegion, srcSubRegion, filter, mirrorMode);

		if (filter == tcu::Sampler::LINEAR)
		{
			const tcu::PixelBufferAccess	unclampedSubRegion	= tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y);
			scaleFromWholeSrcBuffer(unclampedSubRegion, src, srcOffset, srcExtent, filter);
		}
	}
}